

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall clog::Logger::Impl::finish(Impl *this)

{
  ulong __n;
  char *__dest;
  self *psVar1;
  LogStream *this_00;
  char **ppcVar2;
  
  psVar1 = LogStream::operator<<(&this->_stream," - ");
  __n = (this->_file)._size;
  __dest = (psVar1->_buffer).cur_;
  ppcVar2 = &(psVar1->_buffer).cur_;
  if (__n < (ulong)((long)ppcVar2 - (long)__dest)) {
    memcpy(__dest,(this->_file)._data,__n);
    *ppcVar2 = *ppcVar2 + __n;
  }
  psVar1 = LogStream::operator<<(psVar1,":");
  this_00 = LogStream::operator<<(psVar1,this->_line);
  LogStream::operator<<(this_00,"\n");
  return;
}

Assistant:

void Logger::Impl::finish()
{
    _stream << " - " << _file << ":" << _line << "\n\0"; 
}